

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O0

void __thiscall TNT::Array2D<double>::Array2D(Array2D<double> *this,int m,int n)

{
  double **ppdVar1;
  int local_34;
  double *pdStack_30;
  int i;
  double *p;
  int n_local;
  int m_local;
  Array2D<double> *this_local;
  
  Array1D<double>::Array1D(&this->data_,m * n);
  Array1D<double_*>::Array1D(&this->v_,m);
  this->m_ = m;
  this->n_ = n;
  if ((0 < m) && (0 < n)) {
    pdStack_30 = Array1D<double>::operator[](&this->data_,0);
    for (local_34 = 0; local_34 < m; local_34 = local_34 + 1) {
      ppdVar1 = Array1D<double_*>::operator[](&this->v_,local_34);
      *ppdVar1 = pdStack_30;
      pdStack_30 = pdStack_30 + n;
    }
  }
  return;
}

Assistant:

Array2D<T>::Array2D(int m, int n) : data_(m*n), v_(m), m_(m), n_(n)
{
	if (m>0 && n>0)
	{
		T* p = &(data_[0]);
		for (int i=0; i<m; i++)
		{
			v_[i] = p;
			p += n;
		}
	}
}